

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall SymmetricAlgorithm::isBlockCipher(SymmetricAlgorithm *this)

{
  SymmetricAlgorithm *this_local;
  bool local_1;
  
  if ((this->currentCipherMode == CBC) || (this->currentCipherMode == ECB)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SymmetricAlgorithm::isBlockCipher()
{
	switch (currentCipherMode)
	{
		case SymMode::CBC:
		case SymMode::ECB:
			return true;
		default:
			break;
	}

	return false;
}